

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConeShape.cpp
# Opt level: O1

void __thiscall btConeShape::btConeShape(btConeShape *this,btScalar radius,btScalar height)

{
  float fVar1;
  
  btConvexInternalShape::btConvexInternalShape(&this->super_btConvexInternalShape);
  (this->super_btConvexInternalShape).super_btConvexShape.super_btCollisionShape.
  _vptr_btCollisionShape = (_func_int **)&PTR__btConvexShape_002253c8;
  this->m_radius = radius;
  this->m_height = height;
  (this->super_btConvexInternalShape).super_btConvexShape.super_btCollisionShape.m_shapeType = 0xb;
  this->m_coneIndices[0] = 0;
  this->m_coneIndices[1] = 1;
  this->m_coneIndices[2] = 2;
  (this->super_btConvexInternalShape).m_implicitShapeDimensions.m_floats[0] = radius;
  (this->super_btConvexInternalShape).m_implicitShapeDimensions.m_floats[1] = height;
  (this->super_btConvexInternalShape).m_implicitShapeDimensions.m_floats[2] = radius;
  fVar1 = radius * radius + height * height;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  *(float *)&(this->super_btConvexInternalShape).field_0x44 = radius / fVar1;
  return;
}

Assistant:

btConeShape::btConeShape (btScalar radius,btScalar height): btConvexInternalShape (),
m_radius (radius),
m_height(height)
{
	m_shapeType = CONE_SHAPE_PROXYTYPE;
	setConeUpIndex(1);
	btVector3 halfExtents;
	m_sinAngle = (m_radius / btSqrt(m_radius * m_radius + m_height * m_height));
}